

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::AuthenticatedStream,kj::WaiterQueue<kj::AuthenticatedStream>::Node>::
AdapterPromiseNode<kj::List<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode,&kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode::link>&>
          (AdapterPromiseNode<kj::AuthenticatedStream,kj::WaiterQueue<kj::AuthenticatedStream>::Node>
           *this,List<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode,_&kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode::link>
                 *params)

{
  List<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode,_&kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode::link>
  *queue;
  List<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode,_&kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode::link>
  *params_local;
  AdapterPromiseNode<kj::AuthenticatedStream,_kj::WaiterQueue<kj::AuthenticatedStream>::Node>
  *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<kj::AuthenticatedStream>::PromiseFulfiller
            ((PromiseFulfiller<kj::AuthenticatedStream> *)(this + 0x18));
  *(undefined ***)this = &PTR_destroy_00c16950;
  *(undefined ***)(this + 0x18) = &PTR_reject_00c169a0;
  ExceptionOr<kj::AuthenticatedStream>::ExceptionOr
            ((ExceptionOr<kj::AuthenticatedStream> *)(this + 0x20));
  this[0x1e0] = (AdapterPromiseNode<kj::AuthenticatedStream,kj::WaiterQueue<kj::AuthenticatedStream>::Node>
                 )0x1;
  queue = fwd<kj::List<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode,&kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode::link>&>
                    (params);
  WaiterQueue<kj::AuthenticatedStream>::Node::Node
            ((Node *)(this + 0x1e8),(PromiseFulfiller<kj::AuthenticatedStream> *)(this + 0x18),queue
            );
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}